

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

void __thiscall Centaurus::CATNNode<char>::CATNNode(CATNNode<char> *this,Identifier *id)

{
  Identifier *id_local;
  CATNNode<char> *this_local;
  
  this->_vptr_CATNNode = (_func_int **)&PTR__CATNNode_0028fce8;
  std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
  vector(&this->m_transitions);
  Identifier::Identifier(&this->m_submachine,id);
  this->m_source = -1;
  return;
}

Assistant:

CATNNode(const Identifier& id)
        : m_submachine(id), m_source(-1)
    {
    }